

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O2

StateVector __thiscall
stateObservation::ZeroDelayObserver::getEstimatedState(ZeroDelayObserver *this,TimeIndex k)

{
  long lVar1;
  long in_RDX;
  Index extraout_RDX;
  TimeIndex i;
  StateVector SVar2;
  void *local_40 [2];
  
  if (*(char *)(k + 0x20) == '\0') {
    __assert_fail("stateIsSet() && \"The state vector has not been set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x93,
                  "virtual ObserverBase::StateVector stateObservation::ZeroDelayObserver::getEstimatedState(TimeIndex)"
                 );
  }
  lVar1 = (**(code **)(*(long *)k + 0x110))(k);
  if (lVar1 <= in_RDX) {
    for (; in_RDX != lVar1; lVar1 = lVar1 + 1) {
      (**(code **)(*(long *)k + 0x138))(local_40,k);
      free(local_40[0]);
      if (*(long *)(k + 0x40) < in_RDX) {
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::popFront((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)(k + 0x40));
      }
      if ((0 < *(long *)(k + 0x18)) && (*(long *)(k + 0x98) < in_RDX)) {
        IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::popFront((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)(k + 0x98));
      }
    }
    IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::check_
              ((IndexedMatrixT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_false> *)(k + 0x20));
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)this,
               (DenseStorage<double,__1,__1,_1,_0> *)(k + 0x30));
    SVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    SVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (StateVector)
           SVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("k0 <= k && \"ERROR: The observer cannot estimate previous states\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,0x97,
                "virtual ObserverBase::StateVector stateObservation::ZeroDelayObserver::getEstimatedState(TimeIndex)"
               );
}

Assistant:

ObserverBase::StateVector ZeroDelayObserver::getEstimatedState(TimeIndex k)
{
  BOOST_ASSERT(stateIsSet() && "The state vector has not been set");

  TimeIndex k0 = getCurrentTime();

  BOOST_ASSERT(k0 <= k && "ERROR: The observer cannot estimate previous states");

  for(TimeIndex i = k0; i < k; ++i)
  {
    oneStepEstimation_();
    if(y_.getFirstIndex() < k) y_.popFront();

    if(p_ > 0)
      if(u_.getFirstIndex() < k) u_.popFront();
  }

  return x_();
}